

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int phf_keycmp<unsigned_int>(phf_key<unsigned_int> *a,phf_key<unsigned_int> *b)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  iVar3 = -1;
  if (*a->n <= *b->n) {
    if (*a->n < *b->n) {
      return 1;
    }
    uVar1 = b->g;
    uVar2 = a->g;
    if ((((uVar1 > uVar2 || uVar2 == uVar1) && (iVar3 = 1, uVar1 <= uVar2)) && (iVar3 = 0, a != b))
       && (a->k == b->k)) {
      __assert_fail("!(a->k == b->k)",
                    "/workspace/llm4binary/github/license_c_cmakelists/bakwc[P]JamSpell/contrib/phf/phf.cc"
                    ,0x1e4,
                    "int phf_keycmp(const phf_key<T> *, const phf_key<T> *) [T = unsigned int]");
    }
  }
  return iVar3;
}

Assistant:

static int phf_keycmp(const phf_key<T> *a, const phf_key<T> *b) {
	if (*(a->n) > *(b->n))
		return -1;
	if (*(a->n) < *(b->n))
		return 1;
	if (a->g > b->g)
		return -1;
	if (a->g < b->g)
		return 1;

	/* duplicate key? */
	if (a->k == b->k && a != b) {
		assert(!(a->k == b->k));
		abort(); /* if NDEBUG defined */
	}

	return 0;
}